

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_oam_no_mode_check(Emulator *e,MaskedAddress addr,u8 value)

{
  Obj *pOVar1;
  Obj *obj;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  pOVar1 = (e->state).oam + (addr >> 2);
  switch(addr & 3) {
  case 0:
    pOVar1->y = value + 0xf0;
    break;
  case 1:
    pOVar1->x = value + 0xf8;
    break;
  case 2:
    pOVar1->tile = value;
    break;
  case 3:
    pOVar1->byte3 = value;
    pOVar1->priority = (int)(uint)value >> 7;
    pOVar1->yflip = (int)(uint)value >> 6 & TRUE;
    pOVar1->xflip = (int)(uint)value >> 5 & TRUE;
    pOVar1->palette = (byte)((int)(uint)value >> 4) & 1;
    pOVar1->bank = (byte)((int)(uint)value >> 3) & 1;
    pOVar1->cgb_palette = value & 7;
  }
  return;
}

Assistant:

static void write_oam_no_mode_check(Emulator* e, MaskedAddress addr, u8 value) {
  Obj* obj = &OAM[addr >> 2];
  switch (addr & 3) {
    case 0: obj->y = value - OBJ_Y_OFFSET; break;
    case 1: obj->x = value - OBJ_X_OFFSET; break;
    case 2: obj->tile = value; break;
    case 3:
      obj->byte3 = value;
      obj->priority = UNPACK(value, OBJ_PRIORITY);
      obj->yflip = UNPACK(value, OBJ_YFLIP);
      obj->xflip = UNPACK(value, OBJ_XFLIP);
      obj->palette = UNPACK(value, OBJ_PALETTE);
      obj->bank = UNPACK(value, OBJ_BANK);
      obj->cgb_palette = UNPACK(value, OBJ_CGB_PALETTE);
      break;
  }
}